

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

string * __thiscall
TypeOpCallother::getOperatorName_abi_cxx11_
          (string *__return_storage_ptr__,TypeOpCallother *this,PcodeOp *op)

{
  Architecture *pAVar1;
  pointer ppUVar2;
  UserPcodeOp *pUVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_1b0 [32];
  ostringstream res;
  
  if (op->parent != (BlockBasic *)0x0) {
    pAVar1 = op->parent->data->glb;
    uVar4 = (ulong)(int)((*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)->loc).offset;
    ppUVar2 = (pAVar1->userops).useroplist.
              super__Vector_base<UserPcodeOp_*,_std::allocator<UserPcodeOp_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((uVar4 < (ulong)((long)(pAVar1->userops).useroplist.
                               super__Vector_base<UserPcodeOp_*,_std::allocator<UserPcodeOp_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppUVar2 >> 3)) &&
       (pUVar3 = ppUVar2[uVar4], pUVar3 != (UserPcodeOp *)0x0)) {
      (*pUVar3->_vptr_UserPcodeOp[2])(__return_storage_ptr__,pUVar3,op);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::__cxx11::string::string(local_1b0,(string *)&(this->super_TypeOp).name);
  poVar5 = std::operator<<((ostream *)&res,local_1b0);
  std::operator<<(poVar5,'[');
  std::__cxx11::string::~string(local_1b0);
  Varnode::printRaw(*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start,(ostream *)&res);
  std::operator<<((ostream *)&res,']');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  return __return_storage_ptr__;
}

Assistant:

string TypeOpCallother::getOperatorName(const PcodeOp *op) const

{
  const BlockBasic *bb = op->getParent();
  if (bb != (BlockBasic *)0) {
   Architecture *glb = bb->getFuncdata()->getArch();
   int4 index = op->getIn(0)->getOffset();
    UserPcodeOp *userop = glb->userops.getOp(index);
    if (userop != (UserPcodeOp *)0)
      return userop->getOperatorName(op);
  }
  ostringstream res;
  res << TypeOp::getOperatorName(op) << '[';
  op->getIn(0)->printRaw(res);
  res << ']';
  return res.str();
}